

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O2

string * __thiscall
mbc::Val::Person::str_width_abi_cxx11_(string *__return_storage_ptr__,Person *this,int width)

{
  string local_368;
  undefined1 local_348 [8];
  string body_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(this->super_ValBase).is_vaild_ == true) {
    ValBase::str_abi_cxx11_(&local_368,(ValBase *)this->name_);
    std::operator+(&local_228,"name: ",&local_368);
    std::operator+(&local_248,&local_228,", sex: ");
    ValBase::str_abi_cxx11_(&local_208,(ValBase *)this->sex_);
    std::operator+(&local_268,&local_248,&local_208);
    std::operator+(&local_288,&local_268,", telephone: ");
    ValBase::str_abi_cxx11_(&local_1e8,(ValBase *)this->telephone_);
    std::operator+(&local_2a8,&local_288,&local_1e8);
    std::operator+(&local_2c8,&local_2a8,", mail_number: ");
    ValBase::str_abi_cxx11_(&local_1c8,(ValBase *)this->mail_number_);
    std::operator+(&local_2e8,&local_2c8,&local_1c8);
    std::operator+(&local_308,&local_2e8,", email:");
    ValBase::str_abi_cxx11_(&local_1a8,(ValBase *)this->email_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&body_string.field_2 + 8),&local_308,&local_1a8);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&body_string.field_2 + 8),", qq_number: ");
    ValBase::str_abi_cxx11_(&local_188,(ValBase *)this->qq_number_);
    std::operator+(&local_48,&local_c8,&local_188);
    std::operator+(&local_68,&local_48,", location: ");
    ValBase::str_abi_cxx11_(&local_168,(ValBase *)this->location_);
    std::operator+(&local_88,&local_68,&local_168);
    std::operator+(&local_a8,&local_88,", classes: ");
    ValBase::str_abi_cxx11_(&local_148,(ValBase *)this->classes_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_a8,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(body_string.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_368);
    ValBase::str_abi_cxx11_(&local_68,(ValBase *)this->ID_);
    std::operator+(&local_88,"+------| id: ",&local_68);
    std::operator+(&local_a8,&local_88," |------\n");
    std::__cxx11::string::string((string *)&local_108,(string *)local_348);
    units::hard_warp(&local_128,&local_108,width);
    std::__cxx11::string::string((string *)&local_e8,"| ",(allocator *)&local_c8);
    units::add_head(&local_48,&local_128,&local_e8);
    std::operator+(__return_storage_ptr__,&local_a8,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_348);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_ValBase).invaild_waring_);
  }
  return __return_storage_ptr__;
}

Assistant:

const string Person::str_width(int width) const {
    if (*is_vaild_) {
		string body_string =
			"name: " + name_->str() + ", sex: " + sex_->str() + ", telephone: " +
			telephone_->str() + ", mail_number: " + mail_number_->str() + ", email:" +
			email_->str() + ", qq_number: " + qq_number_->str() + ", location: " +
			location_->str() + ", classes: " + classes_->str();
		return "+------| id: " + ID_->str() + " |------\n"
			   + units::add_head(units::hard_warp(body_string, width), "| ");
    } else {
        return *invaild_waring_;
    }
}